

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

TestCaseGroup * vkt::image::createImageFormatReinterpretTests(TestContext *testCtx)

{
  bool bVar1;
  ImageType IVar2;
  TestCaseGroup *pTVar3;
  char *name;
  TestNode *pTVar4;
  LoadStoreTest *this;
  TestNode *node;
  ImageType imageType;
  VkFormat format;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  allocator<char> local_121;
  string local_120;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string caseName;
  int local_78;
  int formatNdx;
  int imageFormatNdx;
  undefined1 local_50 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> groupByImageViewType;
  Texture *texture;
  DefaultDeleter<tcu::TestCaseGroup> local_2d;
  int textureNdx;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  TestContext *testCtx_local;
  
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _8_8_ = testCtx;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar3,(TestContext *)
                    testGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"format_reinterpret",
             "Cases with differing texture and image formats");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_2d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar3
            );
  for (texture._4_4_ = 0; texture._4_4_ < 8; texture._4_4_ = texture._4_4_ + 1) {
    groupByImageViewType.
    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
         (anonymous_namespace)::s_textures + (long)texture._4_4_ * 0x18;
    pTVar3 = (TestCaseGroup *)operator_new(0x70);
    uVar5 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
            m_data._8_8_;
    formatNdx._3_1_ = 1;
    IVar2 = Texture::type((Texture *)
                          groupByImageViewType.
                          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                          .m_data._8_8_);
    getImageTypeName_abi_cxx11_((string *)&imageFormatNdx,(image *)(ulong)IVar2,imageType);
    name = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup(pTVar3,(TestContext *)uVar5,name,"");
    formatNdx._3_1_ = 0;
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&formatNdx + 2));
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_50,
               pTVar3);
    std::__cxx11::string::~string((string *)&imageFormatNdx);
    uVar5 = extraout_RDX;
    for (local_78 = 0; local_78 < 0xd; local_78 = local_78 + 1) {
      for (caseName.field_2._12_4_ = 0; (int)caseName.field_2._12_4_ < 0xd;
          caseName.field_2._12_4_ = caseName.field_2._12_4_ + 1) {
        getFormatShortString_abi_cxx11_
                  (&local_e0,
                   (image *)(ulong)*(uint *)((anonymous_namespace)::s_formats + (long)local_78 * 4),
                   (VkFormat)uVar5);
        std::operator+(&local_c0,&local_e0,"_");
        getFormatShortString_abi_cxx11_
                  (&local_100,
                   (image *)(ulong)*(uint *)((anonymous_namespace)::s_formats +
                                            (long)(int)caseName.field_2._12_4_ * 4),format);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ,&local_c0,&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        if ((local_78 != caseName.field_2._12_4_) &&
           (bVar1 = anon_unknown_0::formatsAreCompatible
                              (*(VkFormat *)((anonymous_namespace)::s_formats + (long)local_78 * 4),
                               *(VkFormat *)
                                ((anonymous_namespace)::s_formats +
                                (long)(int)caseName.field_2._12_4_ * 4)), bVar1)) {
          pTVar4 = &de::details::
                    UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                    operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                *)local_50)->super_TestNode;
          this = (LoadStoreTest *)operator_new(0x98);
          uVar5 = testGroup.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"",&local_121);
          anon_unknown_0::LoadStoreTest::LoadStoreTest
                    (this,(TestContext *)uVar5,(string *)local_a0,&local_120,
                     (Texture *)
                     groupByImageViewType.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_8_,
                     *(VkFormat *)
                      ((anonymous_namespace)::s_formats + (long)(int)caseName.field_2._12_4_ * 4),
                     *(VkFormat *)((anonymous_namespace)::s_formats + (long)local_78 * 4),4);
          tcu::TestNode::addChild(pTVar4,(TestNode *)this);
          std::__cxx11::string::~string((string *)&local_120);
          std::allocator<char>::~allocator(&local_121);
        }
        std::__cxx11::string::~string((string *)local_a0);
        uVar5 = extraout_RDX_00;
      }
    }
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_20)->super_TestNode;
    node = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_50
                   )->super_TestNode;
    tcu::TestNode::addChild(pTVar4,node);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_50);
  }
  pTVar3 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar3;
}

Assistant:

tcu::TestCaseGroup* createImageFormatReinterpretTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "format_reinterpret",	"Cases with differing texture and image formats"));

	for (int textureNdx = 0; textureNdx < DE_LENGTH_OF_ARRAY(s_textures); ++textureNdx)
	{
		const Texture& texture = s_textures[textureNdx];
		de::MovePtr<tcu::TestCaseGroup> groupByImageViewType (new tcu::TestCaseGroup(testCtx, getImageTypeName(texture.type()).c_str(), ""));

		for (int imageFormatNdx = 0; imageFormatNdx < DE_LENGTH_OF_ARRAY(s_formats); ++imageFormatNdx)
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(s_formats); ++formatNdx)
		{
			const std::string caseName = getFormatShortString(s_formats[imageFormatNdx]) + "_" + getFormatShortString(s_formats[formatNdx]);
			if (imageFormatNdx != formatNdx && formatsAreCompatible(s_formats[imageFormatNdx], s_formats[formatNdx]))
				groupByImageViewType->addChild(new LoadStoreTest(testCtx, caseName, "", texture, s_formats[formatNdx], s_formats[imageFormatNdx]));
		}
		testGroup->addChild(groupByImageViewType.release());
	}

	return testGroup.release();
}